

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O3

int fits_quantize_double
              (long row,double *fdata,long nxpix,long nypix,int nullcheck,double in_null_value,
              float qlevel,int dither_method,int *idata,double *bscale,double *bzero,int *iminval,
              int *imaxval)

{
  double dVar1;
  float *pfVar2;
  int iVar3;
  long lVar4;
  size_t __nmemb;
  double *pdVar5;
  double *arr;
  double *arr_00;
  double *__ptr;
  double *__base;
  double *__base_00;
  uint uVar6;
  size_t sVar7;
  size_t sVar8;
  double *pdVar9;
  long lVar10;
  size_t __nmemb_00;
  long lVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  size_t sVar16;
  long lVar17;
  size_t __nmemb_01;
  long lVar18;
  ulong uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  double dVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  size_t local_f0;
  double local_e8;
  long local_c0;
  double local_a8;
  double dStack_a0;
  double local_78;
  double local_68;
  
  lVar18 = nypix * nxpix;
  if (lVar18 < 2) {
    iVar3 = 0;
    dVar24 = 0.0;
    dVar34 = 1.0;
LAB_001b8ef0:
    *bscale = dVar34;
    *bzero = dVar24;
  }
  else {
    if (0.0 <= qlevel) {
      lVar17 = 1;
      __nmemb = nypix;
      if (nxpix < 9) {
        __nmemb = 1;
        lVar17 = nypix;
      }
      __nmemb_01 = lVar17 * nxpix;
      if ((long)__nmemb_01 < 9) {
        if ((long)__nmemb_01 < 1) {
          local_a8 = 0.0;
          dStack_a0 = 0.0;
          local_e8 = 0.0;
          local_68 = -1.79769313486232e+308;
          local_78 = 1.79769313486232e+308;
          lVar17 = 0;
        }
        else {
          local_78 = 1.79769313486232e+308;
          local_68 = -1.79769313486232e+308;
          lVar10 = 0;
          lVar17 = 0;
          do {
            dVar34 = fdata[lVar10];
            uVar20 = SUB84(dVar34,0);
            uVar22 = (undefined4)((ulong)dVar34 >> 0x20);
            if (nullcheck == 0) {
LAB_001b7ff4:
              dVar24 = dVar34;
              if (local_78 <= dVar34) {
                dVar24 = local_78;
              }
              local_78 = dVar24;
              if (dVar34 <= local_68) {
                uVar20 = SUB84(local_68,0);
                uVar22 = (undefined4)((ulong)local_68 >> 0x20);
              }
              lVar17 = lVar17 + 1;
              local_68 = (double)CONCAT44(uVar22,uVar20);
            }
            else if ((dVar34 != in_null_value) || (NAN(dVar34) || NAN(in_null_value)))
            goto LAB_001b7ff4;
            lVar10 = lVar10 + 1;
          } while (__nmemb_01 - lVar10 != 0);
          local_a8 = 0.0;
          dStack_a0 = 0.0;
          local_e8 = 0.0;
        }
      }
      else {
        pdVar5 = (double *)calloc(__nmemb_01,8);
        local_a8 = 0.0;
        dStack_a0 = 0.0;
        local_e8 = 0.0;
        if (pdVar5 != (double *)0x0) {
          arr = (double *)calloc(__nmemb_01,8);
          if (arr != (double *)0x0) {
            arr_00 = (double *)calloc(__nmemb_01,8);
            if (arr_00 == (double *)0x0) {
              free(pdVar5);
              pdVar5 = arr;
            }
            else {
              __ptr = (double *)calloc(__nmemb,8);
              if (__ptr == (double *)0x0) {
                free(pdVar5);
                free(arr);
                pdVar5 = arr_00;
              }
              else {
                __base = (double *)calloc(__nmemb,8);
                if (__base == (double *)0x0) {
                  free(pdVar5);
                  free(arr);
                  free(arr_00);
                  pdVar5 = __ptr;
                }
                else {
                  __base_00 = (double *)calloc(__nmemb,8);
                  if (__base_00 != (double *)0x0) {
                    if ((long)__nmemb < 1) {
                      local_a8 = 0.0;
                      dStack_a0 = 0.0;
                      local_68 = -1.79769313486232e+308;
                      local_78 = 1.79769313486232e+308;
                      lVar17 = 0;
LAB_001b9005:
                      local_e8 = 0.0;
                    }
                    else {
                      local_78 = 1.79769313486232e+308;
                      local_68 = -1.79769313486232e+308;
                      sVar16 = 0;
                      __nmemb_00 = 0;
                      local_f0 = 0;
                      pdVar9 = fdata;
                      lVar10 = 0;
                      do {
                        sVar7 = 0;
                        lVar17 = lVar10;
                        if (nullcheck == 0) {
LAB_001b8336:
                          if (sVar7 != __nmemb_01) {
                            lVar4 = sVar16 * __nmemb_01;
                            dVar34 = fdata[lVar4 + sVar7];
                            uVar21 = SUB84(dVar34,0);
                            uVar23 = (undefined4)((ulong)dVar34 >> 0x20);
                            uVar20 = uVar21;
                            uVar22 = uVar23;
                            if (local_78 <= dVar34) {
                              uVar20 = SUB84(local_78,0);
                              uVar22 = (undefined4)((ulong)local_78 >> 0x20);
                            }
                            if (dVar34 <= local_68) {
                              dVar34 = local_68;
                            }
                            sVar7 = sVar7 + 1;
                            if ((long)sVar7 < (long)__nmemb_01 && nullcheck != 0) {
                              do {
                                if ((pdVar9[sVar7] != in_null_value) ||
                                   (NAN(pdVar9[sVar7]) || NAN(in_null_value))) goto LAB_001b83a8;
                                sVar7 = sVar7 + 1;
                              } while (__nmemb_01 - sVar7 != 0);
                            }
                            else {
LAB_001b83a8:
                              if (sVar7 != __nmemb_01) {
                                sVar8 = sVar7 + 1;
                                dVar24 = fdata[lVar4 + sVar7];
                                uVar25 = SUB84(dVar24,0);
                                uVar26 = (undefined4)((ulong)dVar24 >> 0x20);
                                uVar27 = uVar25;
                                uVar28 = uVar26;
                                if ((double)CONCAT44(uVar22,uVar20) <= dVar24) {
                                  uVar27 = uVar20;
                                  uVar28 = uVar22;
                                }
                                if (dVar24 <= dVar34) {
                                  uVar25 = SUB84(dVar34,0);
                                  uVar26 = (undefined4)((ulong)dVar34 >> 0x20);
                                }
                                if ((nullcheck == 0) || ((long)__nmemb_01 <= (long)sVar8)) {
LAB_001b8400:
                                  if (sVar8 != __nmemb_01) {
                                    sVar7 = sVar8 + 1;
                                    dVar34 = fdata[lVar4 + sVar8];
                                    local_78 = dVar34;
                                    if ((double)CONCAT44(uVar28,uVar27) <= dVar34) {
                                      local_78 = (double)CONCAT44(uVar28,uVar27);
                                    }
                                    local_68 = dVar34;
                                    if (dVar34 <= (double)CONCAT44(uVar26,uVar25)) {
                                      local_68 = (double)CONCAT44(uVar26,uVar25);
                                    }
                                    lVar17 = lVar10 + 3;
                                    if ((nullcheck == 0) || ((long)__nmemb_01 <= (long)sVar7)) {
LAB_001b845c:
                                      if (sVar7 != __nmemb_01) {
                                        sVar8 = sVar7 + 1;
                                        dVar31 = fdata[lVar4 + sVar7];
                                        dVar30 = dVar31;
                                        if (local_78 <= dVar31) {
                                          dVar30 = local_78;
                                        }
                                        dVar29 = dVar31;
                                        if (dVar31 <= local_68) {
                                          dVar29 = local_68;
                                        }
                                        lVar17 = lVar10 + 4;
                                        local_78 = dVar30;
                                        local_68 = dVar29;
                                        if ((nullcheck == 0) || ((long)__nmemb_01 <= (long)sVar8)) {
LAB_001b84a9:
                                          if (sVar8 != __nmemb_01) {
                                            sVar7 = sVar8 + 1;
                                            dVar1 = fdata[lVar4 + sVar8];
                                            local_78 = dVar1;
                                            if (dVar30 <= dVar1) {
                                              local_78 = dVar30;
                                            }
                                            local_68 = dVar1;
                                            if (dVar1 <= dVar29) {
                                              local_68 = dVar29;
                                            }
                                            lVar17 = lVar10 + 5;
                                            if ((nullcheck == 0) ||
                                               ((long)__nmemb_01 <= (long)sVar7)) {
LAB_001b851c:
                                              if (sVar7 != __nmemb_01) {
                                                sVar8 = sVar7 + 1;
                                                dVar30 = fdata[lVar4 + sVar7];
                                                dVar29 = dVar30;
                                                if (local_78 <= dVar30) {
                                                  dVar29 = local_78;
                                                }
                                                dVar33 = dVar30;
                                                if (dVar30 <= local_68) {
                                                  dVar33 = local_68;
                                                }
                                                lVar17 = lVar10 + 6;
                                                local_78 = dVar29;
                                                local_68 = dVar33;
                                                if ((nullcheck == 0) ||
                                                   ((long)__nmemb_01 <= (long)sVar8)) {
LAB_001b8569:
                                                  if (sVar8 != __nmemb_01) {
                                                    sVar7 = sVar8 + 1;
                                                    dVar32 = fdata[lVar4 + sVar8];
                                                    dVar35 = dVar32;
                                                    if (dVar29 <= dVar32) {
                                                      dVar35 = dVar29;
                                                    }
                                                    local_68 = dVar32;
                                                    if (dVar32 <= dVar33) {
                                                      local_68 = dVar33;
                                                    }
                                                    lVar17 = lVar10 + 7;
                                                    local_78 = dVar35;
                                                    if ((nullcheck == 0) ||
                                                       ((long)__nmemb_01 <= (long)sVar7)) {
LAB_001b85e1:
                                                      if (sVar7 != __nmemb_01) {
                                                        dVar29 = fdata[lVar4 + sVar7];
                                                        lVar10 = lVar10 + 8;
                                                        local_78 = dVar29;
                                                        if (dVar35 <= dVar29) {
                                                          local_78 = dVar35;
                                                        }
                                                        dVar33 = dVar29;
                                                        if (dVar29 <= local_68) {
                                                          dVar33 = local_68;
                                                        }
                                                        sVar7 = sVar7 + 1;
                                                        lVar17 = lVar10;
                                                        local_68 = dVar33;
                                                        if ((long)sVar7 < (long)__nmemb_01) {
                                                          local_c0 = 0;
                                                          lVar11 = 0;
                                                          uVar20 = SUB84(dVar31,0);
                                                          uVar22 = (int)((ulong)dVar31 >> 0x20);
                                                          uVar27 = SUB84(dVar1,0);
                                                          uVar28 = (int)((ulong)dVar1 >> 0x20);
                                                          do {
                                                            dVar31 = dVar34;
                                                            dVar34 = (double)CONCAT44(uVar22,uVar20)
                                                            ;
                                                            local_68 = dVar33;
                                                            if ((nullcheck != 0) &&
                                                               ((long)sVar7 < (long)__nmemb_01)) {
                                                              while( true ) {
                                                                if ((pdVar9[sVar7] != in_null_value)
                                                                   || (NAN(pdVar9[sVar7]) ||
                                                                       NAN(in_null_value))) break;
                                                                sVar7 = sVar7 + 1;
                                                                if (__nmemb_01 - sVar7 == 0)
                                                                goto LAB_001b87db;
                                                              }
                                                            }
                                                            if (sVar7 == __nmemb_01) break;
                                                            if ((double)CONCAT44(uVar28,uVar27) ==
                                                                dVar30) {
                                                              if ((dVar30 != dVar32) ||
                                                                 (NAN(dVar30) || NAN(dVar32)))
                                                              goto LAB_001b8697;
                                                            }
                                                            else {
LAB_001b8697:
                                                              pdVar5[lVar11] =
                                                                   ABS((double)CONCAT44(uVar28,
                                                  uVar27) - dVar32);
                                                  lVar11 = lVar11 + 1;
                                                  }
                                                  dVar1 = fdata[lVar4 + sVar7];
                                                  if ((((((double)CONCAT44(uVar28,uVar27) != dVar30)
                                                        || (NAN((double)CONCAT44(uVar28,uVar27)) ||
                                                            NAN(dVar30))) || (dVar31 != dVar34)) ||
                                                      ((dVar34 != (double)CONCAT44(uVar28,uVar27) ||
                                                       (NAN(dVar34) ||
                                                        NAN((double)CONCAT44(uVar28,uVar27)))))) ||
                                                     ((dVar30 != dVar32 ||
                                                      (NAN(dVar30) || NAN(dVar32))))) {
                                                    arr[local_c0] =
                                                         ABS((((double)CONCAT44(uVar28,uVar27) +
                                                              (double)CONCAT44(uVar28,uVar27)) -
                                                             dVar31) - dVar32);
                                                    arr_00[local_c0] =
                                                         ABS((double)CONCAT44(uVar23,uVar21) +
                                                             dVar32 * -4.0 +
                                                             (double)CONCAT44(uVar28,uVar27) * 6.0 +
                                                             dVar31 * -4.0 + dVar1);
                                                    local_c0 = local_c0 + 1;
                                                  }
                                                  else {
                                                    lVar10 = lVar10 + 1;
                                                  }
                                                  dVar35 = dVar1;
                                                  if (local_78 <= dVar1) {
                                                    dVar35 = local_78;
                                                  }
                                                  local_78 = dVar35;
                                                  uVar20 = SUB84(dVar1,0);
                                                  uVar22 = (undefined4)((ulong)dVar1 >> 0x20);
                                                  if (dVar1 <= dVar33) {
                                                    uVar20 = SUB84(dVar33,0);
                                                    uVar22 = (undefined4)((ulong)dVar33 >> 0x20);
                                                  }
                                                  sVar7 = sVar7 + 1;
                                                  local_68 = (double)CONCAT44(uVar22,uVar20);
                                                  dVar33 = (double)CONCAT44(uVar22,uVar20);
                                                  uVar21 = SUB84(dVar24,0);
                                                  uVar23 = (undefined4)((ulong)dVar24 >> 0x20);
                                                  uVar20 = uVar27;
                                                  uVar22 = uVar28;
                                                  uVar27 = SUB84(dVar30,0);
                                                  uVar28 = (int)((ulong)dVar30 >> 0x20);
                                                  dVar30 = dVar32;
                                                  dVar32 = dVar29;
                                                  dVar29 = dVar1;
                                                  dVar24 = dVar31;
                                                  } while ((long)sVar7 < (long)__nmemb_01);
LAB_001b87db:
                                                  lVar17 = lVar10 + local_c0;
                                                  if (local_c0 != 0) {
                                                    if (local_c0 == 1) {
                                                      if (lVar11 == 1) {
                                                        __ptr[local_f0] = *pdVar5;
                                                        local_f0 = local_f0 + 1;
                                                      }
                                                      __base[__nmemb_00] = *arr;
                                                      uVar20 = SUB84(*arr_00,0);
                                                      uVar22 = (undefined4)((ulong)*arr_00 >> 0x20);
                                                    }
                                                    else {
                                                      iVar3 = (int)local_c0;
                                                      if (1 < lVar11) {
                                                        dVar34 = quick_select_double(pdVar5,iVar3);
                                                        __ptr[local_f0] = dVar34;
                                                        local_f0 = local_f0 + 1;
                                                      }
                                                      dVar34 = quick_select_double(arr,iVar3);
                                                      __base[__nmemb_00] = dVar34;
                                                      dVar34 = quick_select_double(arr_00,iVar3);
                                                      uVar20 = SUB84(dVar34,0);
                                                      uVar22 = (undefined4)((ulong)dVar34 >> 0x20);
                                                    }
                                                    __base_00[__nmemb_00] =
                                                         (double)CONCAT44(uVar22,uVar20);
                                                    __nmemb_00 = __nmemb_00 + 1;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    do {
                                                      if ((pdVar9[sVar7] != in_null_value) ||
                                                         (NAN(pdVar9[sVar7]) || NAN(in_null_value)))
                                                      goto LAB_001b85e1;
                                                      sVar7 = sVar7 + 1;
                                                    } while (__nmemb_01 - sVar7 != 0);
                                                  }
                                                  }
                                                }
                                                else {
                                                  do {
                                                    if ((pdVar9[sVar8] != in_null_value) ||
                                                       (NAN(pdVar9[sVar8]) || NAN(in_null_value)))
                                                    goto LAB_001b8569;
                                                    sVar8 = sVar8 + 1;
                                                  } while (__nmemb_01 - sVar8 != 0);
                                                }
                                              }
                                            }
                                            else {
                                              do {
                                                if ((pdVar9[sVar7] != in_null_value) ||
                                                   (NAN(pdVar9[sVar7]) || NAN(in_null_value)))
                                                goto LAB_001b851c;
                                                sVar7 = sVar7 + 1;
                                              } while (__nmemb_01 - sVar7 != 0);
                                            }
                                          }
                                        }
                                        else {
                                          do {
                                            if ((pdVar9[sVar8] != in_null_value) ||
                                               (NAN(pdVar9[sVar8]) || NAN(in_null_value)))
                                            goto LAB_001b84a9;
                                            sVar8 = sVar8 + 1;
                                          } while (__nmemb_01 - sVar8 != 0);
                                        }
                                      }
                                    }
                                    else {
                                      do {
                                        if ((pdVar9[sVar7] != in_null_value) ||
                                           (NAN(pdVar9[sVar7]) || NAN(in_null_value)))
                                        goto LAB_001b845c;
                                        sVar7 = sVar7 + 1;
                                      } while (__nmemb_01 - sVar7 != 0);
                                    }
                                    goto LAB_001b84c0;
                                  }
                                }
                                else {
                                  do {
                                    if ((pdVar9[sVar8] != in_null_value) ||
                                       (NAN(pdVar9[sVar8]) || NAN(in_null_value)))
                                    goto LAB_001b8400;
                                    sVar8 = sVar8 + 1;
                                  } while (__nmemb_01 - sVar8 != 0);
                                }
                                lVar17 = lVar10 + 2;
                                local_68 = (double)CONCAT44(uVar26,uVar25);
                                local_78 = (double)CONCAT44(uVar28,uVar27);
                                goto LAB_001b84c0;
                              }
                            }
                            lVar17 = lVar10 + 1;
                            local_68 = dVar34;
                            local_78 = (double)CONCAT44(uVar22,uVar20);
                          }
                        }
                        else {
                          do {
                            if ((pdVar9[sVar7] != in_null_value) ||
                               (NAN(pdVar9[sVar7]) || NAN(in_null_value))) goto LAB_001b8336;
                            sVar7 = sVar7 + 1;
                          } while (__nmemb_01 - sVar7 != 0);
                        }
LAB_001b84c0:
                        sVar16 = sVar16 + 1;
                        pdVar9 = pdVar9 + __nmemb_01;
                        lVar10 = lVar17;
                      } while (sVar16 != __nmemb);
                      if (__nmemb_00 == 0) {
                        local_a8 = 0.0;
                        dStack_a0 = 0.0;
                      }
                      else if (__nmemb_00 == 1) {
                        local_a8 = *__base;
                        dStack_a0 = *__base_00;
                      }
                      else {
                        qsort(__base,__nmemb_00,8,FnCompare_double);
                        qsort(__base_00,__nmemb_00,8,FnCompare_double);
                        lVar10 = ((__nmemb_00 - ((long)(__nmemb_00 - 1) >> 0x3f)) - 1 &
                                 0x3ffffffffffffffe) * 4;
                        lVar4 = (__nmemb_00 - ((long)__nmemb_00 >> 0x3f) & 0x3ffffffffffffffe) * 4;
                        local_a8 = (*(double *)((long)__base + lVar4) +
                                   *(double *)((long)__base + lVar10)) * 0.5;
                        dStack_a0 = (*(double *)((long)__base_00 + lVar4) +
                                    *(double *)((long)__base_00 + lVar10)) * 0.5;
                      }
                      if (local_f0 == 0) goto LAB_001b9005;
                      if (local_f0 == 1) {
                        local_e8 = *__ptr;
                      }
                      else {
                        qsort(__ptr,local_f0,8,FnCompare_double);
                        local_e8 = (*(double *)
                                     ((long)__ptr +
                                     ((local_f0 - ((long)(local_f0 - 1) >> 0x3f)) - 1 &
                                     0xfffffffffffffffe) * 4) +
                                   *(double *)
                                    ((long)__ptr +
                                    (local_f0 - ((long)local_f0 >> 0x3f) & 0xfffffffffffffffe) * 4))
                                   * 0.5;
                      }
                    }
                    local_e8 = local_e8 * 1.0483579;
                    local_a8 = local_a8 * 0.6052697;
                    dStack_a0 = dStack_a0 * 0.1772048;
                    free(__base_00);
                    free(__base);
                    free(__ptr);
                    free(arr_00);
                    free(arr);
                    free(pdVar5);
                    goto LAB_001b8a56;
                  }
                  free(pdVar5);
                  free(arr);
                  free(arr_00);
                  free(__ptr);
                  pdVar5 = __base;
                }
              }
            }
          }
          free(pdVar5);
        }
        lVar17 = 0;
        local_78 = 0.0;
        local_68 = 0.0;
      }
LAB_001b8a56:
      if ((nullcheck == 0) || (lVar17 != 0)) {
        if (local_e8 == 0.0 || local_a8 <= local_e8) {
          local_e8 = local_a8;
        }
        if (((dStack_a0 != 0.0) || (NAN(dStack_a0))) && (dStack_a0 < local_e8)) {
          local_e8 = dStack_a0;
        }
      }
      else {
        local_68 = 1.0;
        local_78 = 0.0;
        local_e8 = 1.0;
      }
      dVar34 = local_e8 / (double)qlevel;
      if ((qlevel == 0.0) && (!NAN(qlevel))) {
        dVar34 = local_e8 * 0.25;
      }
      if ((dVar34 != 0.0) || (NAN(dVar34))) goto LAB_001b8af8;
    }
    else {
      dVar34 = (double)-qlevel;
      lVar4 = 1;
      lVar10 = nypix;
      if (nxpix < 5) {
        lVar10 = 1;
        lVar4 = nypix;
      }
      lVar4 = lVar4 * nxpix;
      if (lVar4 < 5) {
        if (lVar4 < 1) {
LAB_001b8927:
          local_68 = -1.79769313486232e+308;
          local_78 = 1.79769313486232e+308;
          lVar17 = 0;
        }
        else {
          local_78 = 1.79769313486232e+308;
          local_68 = -1.79769313486232e+308;
          lVar17 = 0;
          lVar10 = 0;
          do {
            dVar24 = fdata[lVar10];
            uVar20 = SUB84(dVar24,0);
            uVar22 = (undefined4)((ulong)dVar24 >> 0x20);
            if (nullcheck == 0) {
LAB_001b7f7a:
              dVar31 = dVar24;
              if (local_78 <= dVar24) {
                dVar31 = local_78;
              }
              local_78 = dVar31;
              if (dVar24 <= local_68) {
                uVar20 = SUB84(local_68,0);
                uVar22 = (undefined4)((ulong)local_68 >> 0x20);
              }
              lVar17 = lVar17 + 1;
              local_68 = (double)CONCAT44(uVar22,uVar20);
            }
            else if ((dVar24 != in_null_value) || (NAN(dVar24) || NAN(in_null_value)))
            goto LAB_001b7f7a;
            lVar10 = lVar10 + 1;
          } while (lVar4 - lVar10 != 0);
        }
      }
      else {
        if (lVar10 < 1) goto LAB_001b8927;
        local_78 = 1.79769313486232e+308;
        local_68 = -1.79769313486232e+308;
        lVar17 = 0;
        lVar11 = 0;
        pdVar5 = fdata;
        do {
          lVar14 = 0;
          if (nullcheck == 0) {
LAB_001b8077:
            if (lVar14 != lVar4) {
              lVar12 = lVar11 * lVar4;
              dVar24 = fdata[lVar12 + lVar14];
              uVar20 = SUB84(dVar24,0);
              uVar22 = (undefined4)((ulong)dVar24 >> 0x20);
              dVar31 = dVar24;
              if (local_78 <= dVar24) {
                dVar31 = local_78;
              }
              local_78 = dVar31;
              if (dVar24 <= local_68) {
                uVar20 = SUB84(local_68,0);
                uVar22 = (undefined4)((ulong)local_68 >> 0x20);
              }
              lVar14 = lVar14 + 1;
              if (lVar14 < lVar4 && nullcheck != 0) {
                do {
                  if ((pdVar5[lVar14] != in_null_value) ||
                     (NAN(pdVar5[lVar14]) || NAN(in_null_value))) goto LAB_001b80cc;
                  lVar14 = lVar14 + 1;
                } while (lVar4 - lVar14 != 0);
              }
              else {
LAB_001b80cc:
                if (lVar14 != lVar4) {
                  lVar15 = lVar14 + 1;
                  local_68 = fdata[lVar12 + lVar14];
                  dVar24 = local_68;
                  if (local_78 <= local_68) {
                    dVar24 = local_78;
                  }
                  local_78 = dVar24;
                  if (local_68 <= (double)CONCAT44(uVar22,uVar20)) {
                    local_68 = (double)CONCAT44(uVar22,uVar20);
                  }
                  if ((nullcheck == 0) || (lVar4 <= lVar15)) {
LAB_001b8128:
                    if (lVar15 != lVar4) {
                      lVar14 = lVar15 + 1;
                      dVar24 = fdata[lVar12 + lVar15];
                      uVar20 = SUB84(dVar24,0);
                      uVar22 = (undefined4)((ulong)dVar24 >> 0x20);
                      if (local_78 <= dVar24) {
                        uVar20 = SUB84(local_78,0);
                        uVar22 = (undefined4)((ulong)local_78 >> 0x20);
                      }
                      if (dVar24 <= local_68) {
                        dVar24 = local_68;
                      }
                      local_68 = dVar24;
                      if ((nullcheck == 0) || (lVar4 <= lVar14)) {
LAB_001b8166:
                        if (lVar14 != lVar4) {
                          dVar24 = fdata[lVar12 + lVar14];
                          uVar21 = SUB84(dVar24,0);
                          uVar23 = (undefined4)((ulong)dVar24 >> 0x20);
                          local_78 = dVar24;
                          if ((double)CONCAT44(uVar22,uVar20) <= dVar24) {
                            local_78 = (double)CONCAT44(uVar22,uVar20);
                          }
                          if (dVar24 <= local_68) {
                            uVar21 = SUB84(local_68,0);
                            uVar23 = (undefined4)((ulong)local_68 >> 0x20);
                          }
                          lVar14 = lVar14 + 1;
                          dVar24 = local_78;
                          if (lVar14 < lVar4) {
                            do {
                              local_78 = dVar24;
                              if ((nullcheck != 0) && (lVar14 < lVar4)) {
                                while( true ) {
                                  if ((pdVar5[lVar14] != in_null_value) ||
                                     (NAN(pdVar5[lVar14]) || NAN(in_null_value))) break;
                                  lVar14 = lVar14 + 1;
                                  if (lVar4 - lVar14 == 0) goto LAB_001b81e4;
                                }
                              }
                              if (lVar14 == lVar4) goto LAB_001b81e4;
                              local_68 = fdata[lVar12 + lVar14];
                              local_78 = local_68;
                              if (dVar24 <= local_68) {
                                local_78 = dVar24;
                              }
                              if (local_68 <= (double)CONCAT44(uVar23,uVar21)) {
                                local_68 = (double)CONCAT44(uVar23,uVar21);
                              }
                              lVar17 = lVar17 + 1;
                              lVar14 = lVar14 + 1;
                              uVar21 = SUB84(local_68,0);
                              uVar23 = (undefined4)((ulong)local_68 >> 0x20);
                              dVar24 = local_78;
                            } while (lVar14 < lVar4);
                          }
                          else {
LAB_001b81e4:
                            local_68 = (double)CONCAT44(uVar23,uVar21);
                          }
                          lVar17 = lVar17 + 4;
                          goto LAB_001b80da;
                        }
                      }
                      else {
                        do {
                          if ((pdVar5[lVar14] != in_null_value) ||
                             (NAN(pdVar5[lVar14]) || NAN(in_null_value))) goto LAB_001b8166;
                          lVar14 = lVar14 + 1;
                        } while (lVar4 - lVar14 != 0);
                      }
                      local_78 = (double)CONCAT44(uVar22,uVar20);
                    }
                  }
                  else {
                    do {
                      if ((pdVar5[lVar15] != in_null_value) ||
                         (NAN(pdVar5[lVar15]) || NAN(in_null_value))) goto LAB_001b8128;
                      lVar15 = lVar15 + 1;
                    } while (lVar4 - lVar15 != 0);
                  }
                  goto LAB_001b80da;
                }
              }
              local_68 = (double)CONCAT44(uVar22,uVar20);
            }
          }
          else {
            do {
              if ((pdVar5[lVar14] != in_null_value) || (NAN(pdVar5[lVar14]) || NAN(in_null_value)))
              goto LAB_001b8077;
              lVar14 = lVar14 + 1;
            } while (lVar4 - lVar14 != 0);
          }
LAB_001b80da:
          lVar11 = lVar11 + 1;
          pdVar5 = pdVar5 + lVar4;
        } while (lVar11 != lVar10);
      }
LAB_001b8af8:
      dVar24 = (local_68 - local_78) / dVar34;
      if (dVar24 <= 4294967284.0) {
        if (row < 1) {
          iVar3 = 0;
          uVar19 = 0;
          if (lVar17 == lVar18) goto LAB_001b8c5a;
          dVar24 = dVar34 * 2147483637.0 + local_78;
LAB_001b8d2d:
          lVar17 = 0;
          do {
            dVar31 = fdata[lVar17];
            if ((dVar31 != in_null_value) || (NAN(dVar31) || NAN(in_null_value))) {
              dVar31 = (dVar31 - dVar24) / dVar34;
              iVar3 = (int)(dVar31 + *(double *)(&DAT_00201400 + (ulong)(dVar31 < 0.0) * 8));
            }
            else {
              iVar3 = -0x7fffffff;
            }
            idata[lVar17] = iVar3;
            lVar17 = lVar17 + 1;
          } while (lVar18 - lVar17 != 0);
        }
        else {
          if ((fits_rand_value == (float *)0x0) && (iVar3 = fits_init_randoms(), iVar3 != 0)) {
            return 0x71;
          }
          pfVar2 = fits_rand_value;
          uVar19 = (ulong)(uint)((int)(row - 1U) + (int)((row - 1U) / 10000) * -10000);
          iVar3 = (int)(fits_rand_value[uVar19] * 500.0);
          if (lVar17 == lVar18) {
LAB_001b8c5a:
            pfVar2 = fits_rand_value;
            if (dither_method == 2) {
              dVar24 = dVar34 * 2147483637.0 + local_78;
            }
            else if (2147483637.0 <= dVar24) {
              dVar24 = (local_78 + local_68) * 0.5;
            }
            else {
              dVar24 = (double)(long)(local_78 / dVar34 + 0.5) * dVar34;
            }
            if (row < 1) {
              lVar17 = 0;
              do {
                dVar31 = (fdata[lVar17] - dVar24) / dVar34;
                idata[lVar17] =
                     (int)(dVar31 + *(double *)(&DAT_00201400 + (ulong)(dVar31 < 0.0) * 8));
                lVar17 = lVar17 + 1;
              } while (lVar18 - lVar17 != 0);
            }
            else {
              lVar17 = 0;
              do {
                dVar31 = fdata[lVar17];
                if (dither_method == 2) {
                  iVar13 = -0x7ffffffe;
                  if ((dVar31 != 0.0) || (NAN(dVar31))) goto LAB_001b8dd7;
                }
                else {
LAB_001b8dd7:
                  dVar31 = (double)pfVar2[iVar3] + (dVar31 - dVar24) / dVar34 + -0.5;
                  iVar13 = (int)(dVar31 + *(double *)(&DAT_00201400 + (ulong)(dVar31 < 0.0) * 8));
                }
                idata[lVar17] = iVar13;
                iVar3 = iVar3 + 1;
                if (iVar3 == 10000) {
                  uVar6 = (int)uVar19 + 1;
                  uVar19 = (ulong)uVar6;
                  if (uVar6 == 10000) {
                    uVar19 = 0;
                  }
                  iVar3 = (int)(pfVar2[(int)uVar19] * 500.0);
                }
                lVar17 = lVar17 + 1;
              } while (lVar18 - lVar17 != 0);
            }
          }
          else {
            dVar24 = dVar34 * 2147483637.0 + local_78;
            if (row < 1) goto LAB_001b8d2d;
            lVar17 = 0;
            do {
              dVar31 = fdata[lVar17];
              if ((dVar31 != in_null_value) || (NAN(dVar31) || NAN(in_null_value))) {
                if (dither_method == 2) {
                  iVar13 = -0x7ffffffe;
                  if ((dVar31 == 0.0) && (!NAN(dVar31))) goto LAB_001b8c11;
                }
                dVar31 = (double)pfVar2[iVar3] + (dVar31 - dVar24) / dVar34 + -0.5;
                iVar13 = (int)(dVar31 + *(double *)(&DAT_00201400 + (ulong)(dVar31 < 0.0) * 8));
              }
              else {
                iVar13 = -0x7fffffff;
              }
LAB_001b8c11:
              idata[lVar17] = iVar13;
              iVar3 = iVar3 + 1;
              if (iVar3 == 10000) {
                uVar6 = (int)uVar19 + 1;
                uVar19 = (ulong)uVar6;
                if (uVar6 == 10000) {
                  uVar19 = 0;
                }
                iVar3 = (int)(pfVar2[(int)uVar19] * 500.0);
              }
              lVar17 = lVar17 + 1;
            } while (lVar18 - lVar17 != 0);
          }
        }
        dVar31 = (local_78 - dVar24) / dVar34;
        uVar19 = -(ulong)(dVar31 < 0.0);
        *iminval = (int)((double)(~uVar19 & 0x3fe0000000000000 |
                                 (ulong)((uint)(uVar19 >> 0x20) & 0xbfe00000) << 0x20) + dVar31);
        dVar31 = (local_68 - dVar24) / dVar34;
        uVar19 = -(ulong)(dVar31 < 0.0);
        *imaxval = (int)((double)(~uVar19 & 0x3fe0000000000000 |
                                 (ulong)((uint)(uVar19 >> 0x20) & 0xbfe00000) << 0x20) + dVar31);
        iVar3 = 1;
        goto LAB_001b8ef0;
      }
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int fits_quantize_double (long row, double fdata[], long nxpix, long nypix, int nullcheck, 
	double in_null_value, float qlevel, int dither_method, int idata[], double *bscale,
	double *bzero, int *iminval, int *imaxval) {

/* arguments:
long row            i: tile number = row number in the binary table
                       (this is only used when dithering the quantized values)
double fdata[]      i: array of image pixels to be compressed
long nxpix          i: number of pixels in each row of fdata
long nypix          i: number of rows in fdata
nullcheck           i: check for nullvalues in fdata?
double in_null_value i: value used to represent undefined pixels in fdata
float qlevel        i: quantization level
int dither_method   i; which dithering method to use
int idata[]         o: values of fdata after applying bzero and bscale
double bscale       o: scale factor
double bzero        o: zero offset
int iminval         o: minimum quantized value that is returned
int imaxval         o: maximum quantized value that is returned

The function value will be one if the input fdata were copied to idata;
in this case the parameters bscale and bzero can be used to convert back to
nearly the original floating point values:  fdata ~= idata * bscale + bzero.
If the function value is zero, the data were not copied to idata.
*/

	int status, iseed = 0;
	long i, nx, ngood = 0;
	double stdev, noise2 = 0., noise3 = 0., noise5 = 0.;	/* MAD 2nd, 3rd, and 5th order noise values */
	double minval = 0., maxval = 0.;  /* min & max of fdata */
	double delta;		/* bscale, 1 in idata = delta in fdata */
	double zeropt;	        /* bzero */
	double temp;
        int nextrand = 0;
	extern float *fits_rand_value;
	LONGLONG iqfactor;

	nx = nxpix * nypix;
	if (nx <= 1) {
	    *bscale = 1.;
	    *bzero  = 0.;
	    return (0);
	}

        if (qlevel >= 0.) {

	    /* estimate background noise using MAD pixel differences */
	    FnNoise5_double(fdata, nxpix, nypix, nullcheck, in_null_value, &ngood,
	        &minval, &maxval, &noise2, &noise3, &noise5, &status);      

	    if (nullcheck && ngood == 0) {   /* special case of an image filled with Nulls */
	        /* set parameters to dummy values, which are not used */
		minval = 0.;
		maxval = 1.;
		stdev = 1;
	    } else {

	        /* use the minimum of noise2, noise3, and noise5 as the best noise value */
	        stdev = noise3;
	        if (noise2 != 0. && noise2 < stdev) stdev = noise2;
	        if (noise5 != 0. && noise5 < stdev) stdev = noise5;
            }

	    if (qlevel == 0.)
	        delta = stdev / 4.;  /* default quantization */
	    else
	        delta = stdev / qlevel;

	    if (delta == 0.) 
	        return (0);			/* don't quantize */

	} else {
	    /* negative value represents the absolute quantization level */
	    delta = -qlevel;

	    /* only nned to calculate the min and max values */
	    FnNoise3_double(fdata, nxpix, nypix, nullcheck, in_null_value, &ngood,
	        &minval, &maxval, 0, &status);      
 	}

        /* check that the range of quantized levels is not > range of int */
	if ((maxval - minval) / delta > 2. * 2147483647. - N_RESERVED_VALUES )
	    return (0);			/* don't quantize */

        if (row > 0) { /* we need to dither the quantized values */
            if (!fits_rand_value) 
	       if (fits_init_randoms()) return(MEMORY_ALLOCATION);

	    /* initialize the index to the next random number in the list */
            iseed = (int) ((row - 1) % N_RANDOM);
	    nextrand = (int) (fits_rand_value[iseed] * 500);
	}

        if (ngood == nx) {   /* don't have to check for nulls */
            /* return all positive values, if possible since some */
            /* compression algorithms either only work for positive integers, */
            /* or are more efficient.  */

            if (dither_method == SUBTRACTIVE_DITHER_2)
	    {
                /* shift the range to be close to the value used to represent zeros */
                zeropt = minval - delta * (NULL_VALUE + N_RESERVED_VALUES);
            }
	    else if ((maxval - minval) / delta < 2147483647. - N_RESERVED_VALUES )
            {
                zeropt = minval;
		/* fudge the zero point so it is an integer multiple of delta */
		/* This helps to ensure the same scaling will be performed if the */
		/* file undergoes multiple fpack/funpack cycles */
		iqfactor = (LONGLONG) (zeropt/delta  + 0.5);
		zeropt = iqfactor * delta;               
            }
            else
            {
                /* center the quantized levels around zero */
                zeropt = (minval + maxval) / 2.;
            }

            if (row > 0) {  /* dither the values when quantizing */
       	      for (i = 0;  i < nx;  i++) {

		if (dither_method == SUBTRACTIVE_DITHER_2 && fdata[i] == 0.0) {
		   idata[i] = ZERO_VALUE;
		} else {
		   idata[i] =  NINT((((double) fdata[i] - zeropt) / delta) + fits_rand_value[nextrand] - 0.5);
		}

                nextrand++;
		if (nextrand == N_RANDOM) {
                    iseed++;
		    if (iseed == N_RANDOM) iseed = 0;
	            nextrand = (int) (fits_rand_value[iseed] * 500);
                }
              }
            } else {  /* do not dither the values */

       	        for (i = 0;  i < nx;  i++) {
	            idata[i] = NINT ((fdata[i] - zeropt) / delta);
                }
            } 
        }
        else {
            /* data contains null values; shift the range to be */
            /* close to the value used to represent null values */
            zeropt = minval - delta * (NULL_VALUE + N_RESERVED_VALUES);

            if (row > 0) {  /* dither the values */
	      for (i = 0;  i < nx;  i++) {
                if (fdata[i] != in_null_value) {
		    if (dither_method == SUBTRACTIVE_DITHER_2 && fdata[i] == 0.0) {
		       idata[i] = ZERO_VALUE;
		    } else {
		       idata[i] =  NINT((((double) fdata[i] - zeropt) / delta) + fits_rand_value[nextrand] - 0.5);
		    }
                } else {
                    idata[i] = NULL_VALUE;
                }

                /* increment the random number index, regardless */
                nextrand++;
		if (nextrand == N_RANDOM) {
		    iseed++;
		    if (iseed == N_RANDOM) iseed = 0;
	            nextrand = (int) (fits_rand_value[iseed] * 500);
                }
              }
            } else {  /* do not dither the values */
	       for (i = 0;  i < nx;  i++) {
                 if (fdata[i] != in_null_value)
		    idata[i] =  NINT((fdata[i] - zeropt) / delta);
                 else 
                    idata[i] = NULL_VALUE;
               }
            }
	}

        /* calc min and max values */
        temp = (minval - zeropt) / delta;
        *iminval =  NINT (temp);
        temp = (maxval - zeropt) / delta;
        *imaxval =  NINT (temp);

	*bscale = delta;
	*bzero = zeropt;

	return (1);			/* yes, data have been quantized */
}